

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatingCodec.cc
# Opt level: O0

size_t __thiscall
avro::parsing::ValidatingDecoder<avro::parsing::SimpleParser<avro::parsing::DummyHandler>_>::
arrayStart(ValidatingDecoder<avro::parsing::SimpleParser<avro::parsing::DummyHandler>_> *this)

{
  int iVar1;
  type pDVar2;
  undefined4 extraout_var;
  long in_RDI;
  size_t result;
  size_t in_stack_00000038;
  SimpleParser<avro::parsing::DummyHandler> *in_stack_00000040;
  Kind in_stack_00000274;
  SimpleParser<avro::parsing::DummyHandler> *in_stack_00000278;
  
  SimpleParser<avro::parsing::DummyHandler>::advance(in_stack_00000278,in_stack_00000274);
  pDVar2 = boost::shared_ptr<avro::Decoder>::operator->((shared_ptr<avro::Decoder> *)(in_RDI + 8));
  iVar1 = (*pDVar2->_vptr_Decoder[0x10])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    SimpleParser<avro::parsing::DummyHandler>::popRepeater(in_stack_00000040);
    SimpleParser<avro::parsing::DummyHandler>::advance(in_stack_00000278,in_stack_00000274);
  }
  else {
    SimpleParser<avro::parsing::DummyHandler>::setRepeatCount(in_stack_00000040,in_stack_00000038);
  }
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

size_t ValidatingDecoder<P>::arrayStart()
{
    parser.advance(Symbol::sArrayStart);
    size_t result = base->arrayStart();
    if (result == 0) {
        parser.popRepeater();
        parser.advance(Symbol::sArrayEnd);
    } else {
        parser.setRepeatCount(result);
    }
    return result;
}